

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTiming.c
# Opt level: O0

void Aig_ManUpdateReverseLevel(Aig_Man_t *p,Aig_Obj_t *pObjNew)

{
  int iVar1;
  Vec_Vec_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pObj;
  int local_38;
  int local_34;
  int k;
  int Lev;
  int LevFanin;
  int LevelOld;
  Aig_Obj_t *pTemp;
  Aig_Obj_t *pFanin;
  Aig_Obj_t *pObjNew_local;
  Aig_Man_t *p_local;
  
  if (p->vLevelR == (Vec_Int_t *)0x0) {
    __assert_fail("p->vLevelR != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                  ,0xfb,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
  }
  iVar1 = Aig_ObjIsNode(pObjNew);
  if (iVar1 != 0) {
    if (p->vLevels == (Vec_Vec_t *)0x0) {
      iVar1 = Aig_ManLevels(p);
      pVVar2 = Vec_VecAlloc(iVar1 + 8);
      p->vLevels = pVVar2;
    }
    local_34 = Aig_ObjReverseLevel(p,pObjNew);
    iVar1 = Aig_ObjReverseLevelNew(p,pObjNew);
    if (local_34 != iVar1) {
      Vec_VecClear(p->vLevels);
      Vec_VecPush(p->vLevels,local_34,pObjNew);
      *(ulong *)&pObjNew->field_0x18 = *(ulong *)&pObjNew->field_0x18 & 0xffffffffffffffef | 0x10;
      for (; iVar1 = Vec_VecSize(p->vLevels), local_34 < iVar1; local_34 = local_34 + 1) {
        local_38 = 0;
        while( true ) {
          pVVar3 = Vec_VecEntry(p->vLevels,local_34);
          iVar1 = Vec_PtrSize(pVVar3);
          if (iVar1 <= local_38) break;
          pVVar3 = Vec_VecEntry(p->vLevels,local_34);
          pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pVVar3,local_38);
          *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffef;
          iVar1 = Aig_ObjReverseLevel(p,pAVar4);
          if (iVar1 != local_34) {
            __assert_fail("LevelOld == Lev",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                          ,0x10f,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
          }
          iVar1 = Aig_ObjReverseLevelNew(p,pAVar4);
          Aig_ObjSetReverseLevel(p,pAVar4,iVar1);
          iVar1 = Aig_ObjReverseLevel(p,pAVar4);
          if (iVar1 != local_34) {
            pObj = Aig_ObjFanin0(pAVar4);
            iVar1 = Aig_ObjIsNode(pObj);
            if ((iVar1 != 0) && ((*(ulong *)&pObj->field_0x18 >> 4 & 1) == 0)) {
              iVar1 = Aig_ObjReverseLevel(p,pObj);
              if (iVar1 < local_34) {
                __assert_fail("LevFanin >= Lev",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                              ,0x119,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
              }
              Vec_VecPush(p->vLevels,iVar1,pObj);
              *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xffffffffffffffef | 0x10;
            }
            pAVar4 = Aig_ObjFanin1(pAVar4);
            iVar1 = Aig_ObjIsNode(pAVar4);
            if ((iVar1 != 0) && ((*(ulong *)&pAVar4->field_0x18 >> 4 & 1) == 0)) {
              iVar1 = Aig_ObjReverseLevel(p,pAVar4);
              if (iVar1 < local_34) {
                __assert_fail("LevFanin >= Lev",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                              ,0x121,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
              }
              Vec_VecPush(p->vLevels,iVar1,pAVar4);
              *(ulong *)&pAVar4->field_0x18 =
                   *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffef | 0x10;
            }
          }
          local_38 = local_38 + 1;
        }
      }
    }
    return;
  }
  __assert_fail("Aig_ObjIsNode(pObjNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                ,0xfc,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

void Aig_ManUpdateReverseLevel( Aig_Man_t * p, Aig_Obj_t * pObjNew )
{
    Aig_Obj_t * pFanin, * pTemp;
    int LevelOld, LevFanin, Lev, k;
    assert( p->vLevelR != NULL );
    assert( Aig_ObjIsNode(pObjNew) );
    // allocate level if needed
    if ( p->vLevels == NULL )
        p->vLevels = Vec_VecAlloc( Aig_ManLevels(p) + 8 );
    // check if level has changed
    LevelOld = Aig_ObjReverseLevel(p, pObjNew);
    if ( LevelOld == Aig_ObjReverseLevelNew(p, pObjNew) )
        return;
    // start the data structure for level update
    // we cannot fail to visit a node when using this structure because the 
    // nodes are stored by their _old_ levels, which are assumed to be correct
    Vec_VecClear( p->vLevels );
    Vec_VecPush( p->vLevels, LevelOld, pObjNew );
    pObjNew->fMarkA = 1;
    // recursively update level
    Vec_VecForEachEntryStart( Aig_Obj_t *, p->vLevels, pTemp, Lev, k, LevelOld )
    {
        pTemp->fMarkA = 0;
        LevelOld = Aig_ObjReverseLevel(p, pTemp); 
        assert( LevelOld == Lev );
        Aig_ObjSetReverseLevel( p, pTemp, Aig_ObjReverseLevelNew(p, pTemp) );
        // if the level did not change, to need to check the fanout levels
        if ( Aig_ObjReverseLevel(p, pTemp) == Lev )
            continue;
        // schedule fanins for level update
        pFanin = Aig_ObjFanin0(pTemp);
        if ( Aig_ObjIsNode(pFanin) && !pFanin->fMarkA )
        {
            LevFanin = Aig_ObjReverseLevel( p, pFanin );
            assert( LevFanin >= Lev );
            Vec_VecPush( p->vLevels, LevFanin, pFanin );
            pFanin->fMarkA = 1;
        }
        pFanin = Aig_ObjFanin1(pTemp);
        if ( Aig_ObjIsNode(pFanin) && !pFanin->fMarkA )
        {
            LevFanin = Aig_ObjReverseLevel( p, pFanin );
            assert( LevFanin >= Lev );
            Vec_VecPush( p->vLevels, LevFanin, pFanin );
            pFanin->fMarkA = 1;
        }
    }
}